

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

parser_error parse_world_level(parser *p)

{
  undefined8 *puVar1;
  int iVar2;
  wchar_t wVar3;
  errr eVar4;
  char *pcVar5;
  char *what;
  void *pvVar6;
  void *pvVar7;
  long lVar8;
  long lVar9;
  parser_error pVar10;
  wchar_t i;
  char *local_38;
  
  pcVar5 = parser_getsym(p,"locality");
  wVar3 = parser_getint(p,"depth");
  what = parser_getsym(p,"topography");
  pvVar6 = parser_priv(p);
  iVar2 = *(int *)((long)pvVar6 + 0x10);
  lVar8 = (long)iVar2 + 1;
  *(int *)((long)pvVar6 + 0x10) = (int)lVar8;
  if ((long)iVar2 == 0) {
    pvVar7 = mem_zalloc(0x50);
    *(void **)((long)pvVar6 + 0x18) = pvVar7;
  }
  else {
    pvVar7 = mem_realloc(*(void **)((long)pvVar6 + 0x18),lVar8 * 0x50);
    *(void **)((long)pvVar6 + 0x18) = pvVar7;
    lVar8 = (long)*(int *)((long)pvVar6 + 0x10) * 0x50;
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + -0x50);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + -0x40);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + -0x30);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + -0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)pvVar7 + lVar8 + -0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    pvVar7 = *(void **)((long)pvVar6 + 0x18);
  }
  lVar8 = (long)*(int *)((long)pvVar6 + 0x10) + -1;
  lVar9 = lVar8 * 0x50;
  *(int *)((long)pvVar7 + lVar9) = (int)lVar8;
  eVar4 = grab_name("locality",pcVar5,localities,0x27,&i);
  pVar10 = PARSE_ERROR_INVALID_LOCALITY;
  if (eVar4 == 0) {
    *(wchar_t *)((long)pvVar7 + lVar9 + 0xc) = i;
    *(wchar_t *)((long)pvVar7 + lVar9 + 4) = wVar3;
    local_38 = pcVar5;
    eVar4 = grab_name("topography",what,topography,0xb,&i);
    if (eVar4 == 0) {
      *(wchar_t *)((long)pvVar7 + lVar9 + 0x10) = i;
      pVar10 = PARSE_ERROR_NONE;
      if (i == L'\0') {
        iVar2 = *(int *)((long)pvVar6 + 0x14);
        lVar8 = (long)iVar2 + 1;
        *(int *)((long)pvVar6 + 0x14) = (int)lVar8;
        if ((long)iVar2 == 0) {
          pvVar7 = mem_zalloc(0x28);
        }
        else {
          pvVar7 = mem_realloc(*(void **)((long)pvVar6 + 0x20),lVar8 * 0x28);
        }
        *(void **)((long)pvVar6 + 0x20) = pvVar7;
        *(int *)((long)pvVar7 + (long)*(int *)((long)pvVar6 + 0x14) * 0x28 + -0x28) =
             *(int *)((long)pvVar6 + 0x10) + -1;
        pcVar5 = string_make(local_38);
        lVar8 = *(long *)((long)pvVar6 + 0x20);
        lVar9 = (long)*(int *)((long)pvVar6 + 0x14) * 0x28;
        *(char **)(lVar8 + -0x20 + lVar9) = pcVar5;
        puVar1 = (undefined8 *)(lVar8 + -0x18 + lVar9);
        *puVar1 = 0;
        puVar1[1] = 0;
        *(undefined4 *)(lVar8 + -8 + lVar9) = 0;
      }
    }
  }
  return pVar10;
}

Assistant:

static enum parser_error parse_world_level(struct parser *p) {
	const char *l_name = parser_getsym(p, "locality");
	const int depth = parser_getint(p, "depth");
	const char *t_name = parser_getsym(p, "topography");
	struct level_map *map = parser_priv(p);
	struct level *lev;
	int i;

	/* Make a new level */
	map->num_levels++;
	if (map->num_levels == 1) {
		map->levels = mem_zalloc(sizeof(struct level));
	} else {
		map->levels = mem_realloc(map->levels,
								  map->num_levels * sizeof(struct level));
		memset(&map->levels[map->num_levels - 1], 0, sizeof(struct level));
	}
	lev = &map->levels[map->num_levels - 1];
	lev->index = map->num_levels - 1;

	if (grab_name("locality", l_name, localities, N_ELEMENTS(localities), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev->locality = i;
	lev->depth = depth;
	if (grab_name("topography", t_name, topography, N_ELEMENTS(topography), &i))
		return PARSE_ERROR_INVALID_LOCALITY;
	lev->topography = i;

	/* Record towns */
	if (lev->topography == TOP_TOWN) {
		map->num_towns++;
		if (map->num_towns == 1) {
			map->towns = mem_zalloc(sizeof(struct town));
		} else {
			map->towns = mem_realloc(map->towns,
									 map->num_towns * sizeof(struct town));
		}
		map->towns[map->num_towns - 1].index = map->num_levels - 1;
		map->towns[map->num_towns - 1].code = string_make(l_name);
		map->towns[map->num_towns - 1].ego = NULL;
		map->towns[map->num_towns - 1].stores = NULL;
		map->towns[map->num_towns - 1].num_stores = 0;
	}

	return PARSE_ERROR_NONE;
}